

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O2

IterateResult __thiscall
glcts::GeometryShader_gl_in_ArrayContentsTest::iterate(GeometryShader_gl_in_ArrayContentsTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  uchar *puVar6;
  void *__s1;
  NotSupportedError *this_01;
  long lVar7;
  char *description;
  qpTestResult testResult;
  TestContext *this_02;
  uchar reference_data [72];
  undefined1 local_1b0 [384];
  long lVar5;
  
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_01,"Geometry shader functionality not supported, skipping",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x191);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  puVar6 = reference_data + 0x14;
  reference_data[0x30] = '\0';
  reference_data[0x31] = '\0';
  reference_data[0x32] = '\0';
  reference_data[0x33] = '\0';
  reference_data[0x34] = '\0';
  reference_data[0x35] = '\0';
  reference_data[0x36] = '\0';
  reference_data[0x37] = '\0';
  reference_data[0x38] = '\0';
  reference_data[0x39] = '\0';
  reference_data[0x3a] = '\0';
  reference_data[0x3b] = '\0';
  reference_data[0x3c] = '\0';
  reference_data[0x3d] = '\0';
  reference_data[0x3e] = '\0';
  reference_data[0x3f] = '\0';
  reference_data[0x20] = '\0';
  reference_data[0x21] = '\0';
  reference_data[0x22] = '\0';
  reference_data[0x23] = '\0';
  reference_data[0x24] = '\0';
  reference_data[0x25] = '\0';
  reference_data[0x26] = '\0';
  reference_data[0x27] = '\0';
  reference_data[0x28] = '\0';
  reference_data[0x29] = '\0';
  reference_data[0x2a] = '\0';
  reference_data[0x2b] = '\0';
  reference_data[0x2c] = '\0';
  reference_data[0x2d] = '\0';
  reference_data[0x2e] = '\0';
  reference_data[0x2f] = '\0';
  reference_data[0x40] = '\0';
  reference_data[0x41] = '\0';
  reference_data[0x42] = '\0';
  reference_data[0x43] = '\0';
  reference_data[0x44] = '\0';
  reference_data[0x45] = '\0';
  reference_data[0x46] = '\0';
  reference_data[0x47] = '\0';
  reference_data[0x10] = '\0';
  reference_data[0x11] = '\0';
  reference_data[0x12] = '\0';
  reference_data[0x13] = '\0';
  reference_data[0x14] = '\0';
  reference_data[0x15] = '\0';
  reference_data[0x16] = '\0';
  reference_data[0x17] = '\0';
  reference_data[0x18] = '\0';
  reference_data[0x19] = '\0';
  reference_data[0x1a] = '\0';
  reference_data[0x1b] = '\0';
  reference_data[0x1c] = '\0';
  reference_data[0x1d] = '\0';
  reference_data[0x1e] = '\0';
  reference_data[0x1f] = '\0';
  reference_data[0] = '\0';
  reference_data[1] = '\0';
  reference_data[2] = '\0';
  reference_data[3] = '\0';
  reference_data[4] = '\0';
  reference_data[5] = '\0';
  reference_data[6] = '\0';
  reference_data[7] = '\0';
  reference_data[8] = '\0';
  reference_data[9] = '\0';
  reference_data[10] = '\0';
  reference_data[0xb] = '\0';
  reference_data[0xc] = '\0';
  reference_data[0xd] = '\0';
  reference_data[0xe] = '\0';
  reference_data[0xf] = '\0';
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    *(int *)(puVar6 + -8) = (int)lVar7;
    puVar6[-4] = '\0';
    puVar6[-3] = '\0';
    puVar6[-2] = '\0';
    puVar6[-1] = '\0';
    puVar6[0] = '\x01';
    puVar6[1] = '\0';
    puVar6[2] = '\0';
    puVar6[3] = '\0';
    *(float *)(puVar6 + -0x14) = (float)(int)lVar7;
    puVar6[-0x10] = '\0';
    puVar6[-0xf] = '\0';
    puVar6[-0xe] = '\0';
    puVar6[-0xd] = '\0';
    puVar6[-0xc] = '\0';
    puVar6[-0xb] = '\0';
    puVar6[-10] = '\0';
    puVar6[-9] = '\0';
    puVar6 = puVar6 + 0x18;
  }
  (**(code **)(lVar5 + 0x5e0))(0x8c89);
  (**(code **)(lVar5 + 0x48))(0x8c8e,0,this->m_buffer_object_id);
  bVar1 = true;
  iVar2 = 2;
  do {
    if (iVar2 == 0) {
      this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00cdf039;
    }
    (**(code **)(lVar5 + 0x1680))((&this->m_program_object_sized_arrays_id)[iVar2 == 2]);
    (**(code **)(lVar5 + 0x30))(4);
    (**(code **)(lVar5 + 0x538))(4,0,3);
    (**(code **)(lVar5 + 0x638))();
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error doing a draw call",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1ca);
    __s1 = (void *)(**(code **)(lVar5 + 0xd00))(0x8c8e,0,0x48,1);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Could not map the buffer object into process space",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1d0);
    iVar4 = bcmp(__s1,reference_data,0x48);
    if (iVar4 != 0) {
      local_1b0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Data extracted from transform feedback is invalid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      bVar1 = false;
    }
    (**(code **)(lVar5 + 0x1670))(0x8c8e);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"Error unmapping the buffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                    ,0x1de);
    iVar2 = iVar2 + -1;
  } while (bVar1);
  this_02 = (this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx;
  description = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00cdf039:
  tcu::TestContext::setTestResult(this_02,testResult,description);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult GeometryShader_gl_in_ArrayContentsTest::iterate()
{
	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	initTest();

	const glw::Functions& gl							= m_context.getRenderContext().getFunctions();
	unsigned char		  reference_data[m_buffer_size] = { 0 };
	bool				  result						= true;

	/* Prepare reference data */
	{
		glw::GLint*   ivec4_data_ptr;
		glw::GLfloat* vec2_data_ptr;

		const unsigned int ivec4_offset_from_vertex = 2 * sizeof(glw::GLfloat);
		const unsigned int vec2_offset_from_vertex  = 0;

		/* Expected data for vertex:
		 * vec2  = {VertexID, 0.0f}
		 * ivec4 = {0,        VertexID, 0, 1}
		 */
		for (unsigned int vertex_id = 0; vertex_id < m_n_vertices_emitted_per_primitive * m_n_emitted_primitives;
			 ++vertex_id)
		{
			const unsigned int vertex_offset = vertex_id * m_n_bytes_emitted_per_vertex;
			const unsigned int ivec4_offset  = vertex_offset + ivec4_offset_from_vertex;
			const unsigned int vec2_offset   = vertex_offset + vec2_offset_from_vertex;

			ivec4_data_ptr = (glw::GLint*)(reference_data + ivec4_offset);
			vec2_data_ptr  = (glw::GLfloat*)(reference_data + vec2_offset);

			ivec4_data_ptr[0] = 0;
			ivec4_data_ptr[1] = vertex_id;
			ivec4_data_ptr[2] = 0;
			ivec4_data_ptr[3] = 1;

			vec2_data_ptr[0] = (float)vertex_id;
			vec2_data_ptr[1] = 0.0f;
		}
	}

	/* Setup transform feedback */
	gl.enable(GL_RASTERIZER_DISCARD);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer_object_id);

	/* Draw the geometry */
	for (int n_case = 0; n_case < 2 /* unsized/sized array cases */; ++n_case)
	{
		glw::GLuint po_id = (n_case == 0) ? m_program_object_unsized_arrays_id : m_program_object_sized_arrays_id;

		gl.useProgram(po_id);
		gl.beginTransformFeedback(GL_TRIANGLES);
		{
			gl.drawArrays(GL_TRIANGLES, 0 /* first */, 3 /* one triangle */);
		}
		gl.endTransformFeedback();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error doing a draw call");

		/* Map buffer object storage holding XFB result into process space. */
		glw::GLchar* transform_feedback_data = (glw::GLchar*)gl.mapBufferRange(
			GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, m_buffer_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not map the buffer object into process space");

		/* Verify data extracted from transform feedback */
		if (0 != memcmp(transform_feedback_data, reference_data, m_buffer_size))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Data extracted from transform feedback is invalid."
							   << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Unmap the buffer object. */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Error unmapping the buffer object");

		/* Verify results */
		if (true != result)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}